

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::EnsureHeadStartsFromZero<int>(JavascriptArray *this,Recycler *recycler)

{
  SparseArraySegmentBase **ppSVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *segment;
  SparseArraySegmentBase *ptr;
  SparseArraySegment<int> *newSeg;
  SparseArraySegment<int> *savedLastUsedSegment;
  SparseArraySegment<int> *savedHead;
  Recycler *recycler_local;
  JavascriptArray *this_local;
  
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  if ((*ppSVar1 != (SparseArraySegmentBase *)0x0) &&
     (pSVar2 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head),
     pSVar2->left == 0)) {
    return;
  }
  ClearSegmentMap(this);
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  pSVar2 = &SparseArraySegment<int>::From(*ppSVar1)->super_SparseArraySegmentBase;
  segment = GetLastUsedSegment(this);
  SetHeadAndLastUsedSegment(this,EmptySegment);
  ptr = &SparseArraySegment<int>::AllocateSegment(recycler,0,0,pSVar2)->super_SparseArraySegmentBase
  ;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&ptr->next,pSVar2);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&this->head,ptr);
  SetHasNoMissingValues(this,true);
  SetLastUsedSegment(this,segment);
  return;
}

Assistant:

void JavascriptArray::EnsureHeadStartsFromZero(Recycler * recycler)
    {
        if (head == nullptr || head->left != 0)
        {
            // This is used to fix up altered arrays.
            // any SegmentMap would be invalid at this point.
            ClearSegmentMap();

            //
            // We could OOM and throw when allocating new empty head, resulting in a corrupted array. Need
            // some protection here. Save the head and switch this array to EmptySegment. Will be restored
            // correctly if allocating new segment succeeds.
            //
            SparseArraySegment<T>* savedHead = SparseArraySegment<T>::From(this->head);
            SparseArraySegment<T>* savedLastUsedSegment = (SparseArraySegment<T>*)this->GetLastUsedSegment();
            SetHeadAndLastUsedSegment(const_cast<SparseArraySegmentBase*>(EmptySegment));

            SparseArraySegment<T> *newSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, 0, savedHead);
            newSeg->next = savedHead;
            this->head = newSeg;
            SetHasNoMissingValues();
            this->SetLastUsedSegment(savedLastUsedSegment);
        }
    }